

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SourceArrayLoader::assignSourceValuesToFloatOrDoubleArray
          (SourceArrayLoader *this,SourceBase *sourceBase,FloatOrDoubleArray *floatOrDoubleArray)

{
  int iVar1;
  FloatArray *this_00;
  BaseArrayElement<float> *this_01;
  ArrayPrimitiveType<float> *this_02;
  float *data;
  size_t sVar2;
  DoubleArray *this_03;
  BaseArrayElement<double> *this_04;
  ArrayPrimitiveType<double> *this_05;
  double *data_00;
  FloatOrDoubleArray *in_RDX;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *in_RSI;
  DoubleArray *valuesArray_1;
  DoubleArrayElement *arrayElement_1;
  DoubleSource *source_1;
  DoubleArray *values_1;
  FloatArray *valuesArray;
  FloatArrayElement *arrayElement;
  FloatSource *source;
  FloatArray *values;
  bool local_1;
  
  iVar1 = (*(in_RSI->super_SourceBase)._vptr_SourceBase[2])();
  if (iVar1 == 2) {
    COLLADAFW::FloatOrDoubleArray::setType(in_RDX,DATA_TYPE_FLOAT);
    this_00 = COLLADAFW::FloatOrDoubleArray::getFloatValues(in_RDX);
    this_01 = Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
              ::getArrayElement(in_RSI);
    this_02 = BaseArrayElement<float>::getValues(this_01);
    data = COLLADAFW::ArrayPrimitiveType<float>::getData(this_02);
    sVar2 = COLLADAFW::ArrayPrimitiveType<float>::getCount(this_02);
    COLLADAFW::ArrayPrimitiveType<float>::setData(this_00,data,sVar2);
    COLLADAFW::ArrayPrimitiveType<float>::yieldOwnerShip(this_02);
    local_1 = true;
  }
  else {
    iVar1 = (*(in_RSI->super_SourceBase)._vptr_SourceBase[2])();
    if (iVar1 == 3) {
      COLLADAFW::FloatOrDoubleArray::setType(in_RDX,DATA_TYPE_DOUBLE);
      this_03 = COLLADAFW::FloatOrDoubleArray::getDoubleValues(in_RDX);
      this_04 = Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
                ::getArrayElement((Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
                                   *)in_RSI);
      this_05 = BaseArrayElement<double>::getValues(this_04);
      data_00 = COLLADAFW::ArrayPrimitiveType<double>::getData(this_05);
      sVar2 = COLLADAFW::ArrayPrimitiveType<double>::getCount(this_05);
      COLLADAFW::ArrayPrimitiveType<double>::setData(this_03,data_00,sVar2);
      COLLADAFW::ArrayPrimitiveType<double>::yieldOwnerShip(this_05);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SourceArrayLoader::assignSourceValuesToFloatOrDoubleArray( SourceBase* sourceBase, COLLADAFW::FloatOrDoubleArray& floatOrDoubleArray )
	{
		if (sourceBase->getDataType() == SourceBase::DATA_TYPE_FLOAT)
		{
			floatOrDoubleArray.setType( COLLADAFW::FloatOrDoubleArray::DATA_TYPE_FLOAT);
			COLLADAFW::FloatArray* values = floatOrDoubleArray.getFloatValues();
			FloatSource* source = ( FloatSource* ) sourceBase;
			FloatArrayElement& arrayElement = source->getArrayElement();
			COLLADAFW::FloatArray& valuesArray = arrayElement.getValues();
			values->setData ( valuesArray.getData (), valuesArray.getCount () );
			valuesArray.yieldOwnerShip();
			return true;
		}
		else if (sourceBase->getDataType() == SourceBase::DATA_TYPE_DOUBLE)
		{
			floatOrDoubleArray.setType( COLLADAFW::FloatOrDoubleArray::DATA_TYPE_DOUBLE);
			COLLADAFW::DoubleArray* values = floatOrDoubleArray.getDoubleValues();
			DoubleSource* source = ( DoubleSource* ) sourceBase;
			DoubleArrayElement& arrayElement = source->getArrayElement();
			COLLADAFW::DoubleArray& valuesArray = arrayElement.getValues();
			values->setData ( valuesArray.getData (), valuesArray.getCount () );
			valuesArray.yieldOwnerShip();
			return true;
		}
		else
		{
			return false;
		}
	}